

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O0

pair<cmsys::_Hashtable_iterator<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>,_bool>
* __thiscall
cmsys::
hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
::insert_unique_noresize
          (pair<cmsys::_Hashtable_iterator<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>,_bool>
           *__return_storage_ptr__,
          hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
          *this,value_type_conflict *__obj)

{
  bool bVar1;
  reference pp_Var2;
  int *__x;
  int *__y;
  _Node *p_Var3;
  bool local_61;
  _Hashtable_iterator<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
  local_60;
  _Node *local_50;
  _Node *__tmp;
  _Hashtable_iterator<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
  local_40;
  value_type local_30;
  _Node *__cur;
  _Node *__first;
  size_type __n;
  value_type_conflict *__obj_local;
  hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
  *this_local;
  
  __n = (size_type)__obj;
  __obj_local = (value_type_conflict *)this;
  __first = (_Node *)_M_bkt_num(this,__obj);
  pp_Var2 = std::
            vector<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>::
            operator[](&this->_M_buckets,(size_type)__first);
  local_30 = *pp_Var2;
  __cur = local_30;
  while( true ) {
    if (local_30 == (value_type)0x0) {
      p_Var3 = _M_new_node(this,(value_type_conflict *)__n);
      p_Var3->_M_next = __cur;
      local_50 = p_Var3;
      pp_Var2 = std::
                vector<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>
                ::operator[](&this->_M_buckets,(size_type)__first);
      *pp_Var2 = p_Var3;
      this->_M_num_elements = this->_M_num_elements + 1;
      _Hashtable_iterator<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
      ::_Hashtable_iterator(&local_60,local_50,this);
      local_61 = true;
      std::
      pair<cmsys::_Hashtable_iterator<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>,_bool>
      ::
      pair<cmsys::_Hashtable_iterator<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>,_bool,_true>
                (__return_storage_ptr__,&local_60,&local_61);
      return __return_storage_ptr__;
    }
    __x = _Identity<int>::operator()((_Identity<int> *)&this->field_0x3,&local_30->_M_val);
    __y = _Identity<int>::operator()((_Identity<int> *)&this->field_0x3,(int *)__n);
    bVar1 = std::equal_to<int>::operator()((equal_to<int> *)&this->field_0x2,__x,__y);
    if (bVar1) break;
    local_30 = local_30->_M_next;
  }
  _Hashtable_iterator<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
  ::_Hashtable_iterator(&local_40,local_30,this);
  __tmp._7_1_ = 0;
  std::
  pair<cmsys::_Hashtable_iterator<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>,_bool>
  ::
  pair<cmsys::_Hashtable_iterator<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>,_bool,_true>
            (__return_storage_ptr__,&local_40,(bool *)((long)&__tmp + 7));
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename hashtable<_Val, _Key, _HF, _Ex, _Eq, _All>::iterator, bool>
hashtable<_Val, _Key, _HF, _Ex, _Eq, _All>::insert_unique_noresize(
  const value_type& __obj)
{
  const size_type __n = _M_bkt_num(__obj);
  _Node* __first = _M_buckets[__n];

  for (_Node* __cur = __first; __cur; __cur = __cur->_M_next)
    if (_M_equals(_M_get_key(__cur->_M_val), _M_get_key(__obj)))
      return std::pair<iterator, bool>(iterator(__cur, this), false);

  _Node* __tmp = _M_new_node(__obj);
  __tmp->_M_next = __first;
  _M_buckets[__n] = __tmp;
  ++_M_num_elements;
  return std::pair<iterator, bool>(iterator(__tmp, this), true);
}